

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtesting.c
# Opt level: O0

void RDL_calculate_transitive_closure(char **graph,uint n)

{
  uint uVar1;
  int iVar2;
  void *__ptr;
  RDL_stack *stack;
  uint *puVar3;
  uint *new_element;
  uint *current_element;
  uint *val;
  uint local_30;
  uint current;
  uint j;
  uint i;
  char *visited;
  RDL_stack *dfs_stack;
  uint n_local;
  char **graph_local;
  
  __ptr = malloc((ulong)n);
  for (current = 0; current < n; current = current + 1) {
    stack = RDL_stack_new();
    memset(__ptr,0,(ulong)n);
    puVar3 = (uint *)malloc(4);
    *puVar3 = current;
    RDL_stack_push(stack,puVar3);
    while (iVar2 = RDL_stack_empty(stack), iVar2 == 0) {
      puVar3 = (uint *)RDL_stack_top(stack);
      uVar1 = *puVar3;
      RDL_stack_pop(stack);
      free(puVar3);
      *(undefined1 *)((long)__ptr + (ulong)uVar1) = 1;
      for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
        if (graph[uVar1][local_30] != '\0') {
          graph[current][local_30] = '\x01';
          graph[local_30][current] = '\x01';
          if (*(char *)((long)__ptr + (ulong)local_30) == '\0') {
            puVar3 = (uint *)malloc(4);
            *puVar3 = local_30;
            RDL_stack_push(stack,puVar3);
          }
        }
      }
    }
    RDL_stack_delete(stack);
  }
  free(__ptr);
  return;
}

Assistant:

void RDL_calculate_transitive_closure(char** graph, unsigned n)
{
  RDL_stack* dfs_stack;
  char* visited = (char*)malloc(n * sizeof(*visited));
  unsigned i, j, current;
  unsigned *val, *current_element, *new_element;

  for (i = 0; i < n; ++i) {
    dfs_stack = RDL_stack_new();
    memset(visited, 0, n * sizeof(*visited));

    val = malloc(sizeof(*val));
    *val = i;

    RDL_stack_push(dfs_stack, val);

    while (!RDL_stack_empty(dfs_stack)) {
      current_element = RDL_stack_top(dfs_stack);
      current = *current_element;
      RDL_stack_pop(dfs_stack);
      free(current_element);

      visited[current] = 1;
      for (j = 0; j < n; ++j) {
        if (graph[current][j]) {
          graph[i][j] = 1;
          graph[j][i] = 1;
          if (!visited[j]) {
            new_element = malloc(sizeof(*new_element));
            *new_element = j;
            RDL_stack_push(dfs_stack, new_element);
          }
        }
      }
    }

    RDL_stack_delete(dfs_stack);
  }

  free(visited);
}